

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.cpp
# Opt level: O3

int LiteScript::Syntax::ReadScript
              (char *text,
              vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *instrl,
              ErrorType *errorType)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  uint i;
  uint uVar4;
  char *text_00;
  
  bVar1 = *text;
  if (bVar1 == 0) {
    uVar3 = 0;
LAB_0013b7d8:
    return (int)uVar3;
  }
  uVar3 = 0;
  text_00 = text;
LAB_0013b766:
  uVar4 = 0;
  do {
    if ((bVar1 < 0x21) && ((0x100000600U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
      uVar4 = uVar4 + 1;
    }
    else {
      uVar2 = ReadComment(text_00 + uVar4);
      if (uVar2 == 0) break;
      uVar4 = uVar4 + uVar2;
    }
    bVar1 = text_00[uVar4];
  } while( true );
  if ((int)uVar4 < 1) {
    uVar4 = ReadInstruction(text_00,instrl,errorType);
    if ((int)uVar4 < 1) {
      if (uVar4 == 0) {
        *errorType = SCRPT_ERROR_UNKNOW;
        uVar3 = (ulong)(uint)-(int)uVar3;
      }
      else {
        uVar3 = (ulong)(uVar4 - (int)uVar3);
      }
      goto LAB_0013b7d8;
    }
  }
  uVar3 = (uVar3 & 0xffffffff) + (ulong)uVar4;
  text_00 = text + uVar3;
  bVar1 = text[uVar3];
  if (bVar1 == 0) goto LAB_0013b7d8;
  goto LAB_0013b766;
}

Assistant:

int LiteScript::Syntax::ReadScript(const char *text, std::vector<Instruction> &instrl, Script::ErrorType &errorType) {
    int i = 0, tmp;
    while (text[i] != '\0'){
        if ((tmp = (int)ReadWhitespace(text + i)) > 0)
            i += tmp;
        else if ((tmp = ReadInstruction(text + i, instrl, errorType)) > 0)
            i += tmp;
        else {
            if (tmp != 0)
                return tmp - i;
            else {
                errorType = Script::ErrorType::SCRPT_ERROR_UNKNOW;
                return -i;
            }
        }
    }
    return i;
}